

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O1

shared_ptr<chrono::ChVisualShapeFEA> __thiscall
chrono::ChPhysicsItem::GetVisualShapeFEA(ChPhysicsItem *this,uint i)

{
  long *plVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar3;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::ChVisualShapeFEA> sVar5;
  
  plVar1 = *(long **)(CONCAT44(in_register_00000034,i) + 0x40);
  if (plVar1 == (long *)0x0) {
    (this->super_ChObj)._vptr_ChObj = (_func_int **)0x0;
    (this->super_ChObj).m_name._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    lVar2 = *plVar1;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    lVar2 = *(long *)(lVar2 + 0x18);
    lVar4 = ((ulong)in_RDX._M_pi & 0xffffffff) * 0x10;
    in_RDX._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + lVar4);
    (this->super_ChObj)._vptr_ChObj = (_func_int **)in_RDX._M_pi;
    pcVar3 = *(pointer *)(lVar2 + 8 + lVar4);
    (this->super_ChObj).m_name._M_dataplus._M_p = pcVar3;
    if (pcVar3 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pcVar3 + 8) = *(int *)(pcVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pcVar3 + 8) = *(int *)(pcVar3 + 8) + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX;
    }
  }
  sVar5.super___shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChVisualShapeFEA>)
         sVar5.super___shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChVisualShapeFEA> ChPhysicsItem::GetVisualShapeFEA(unsigned int i) const {
    if (!vis_model_instance)
        return nullptr;
    return vis_model_instance->GetModel()->GetShapeFEA(i);
}